

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_test_basic.c
# Opt level: O1

void verify_heap_entries(VMEMcache *cache,stat_t entries)

{
  long lVar1;
  long *__s1;
  long *plVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  size_t sVar6;
  undefined8 *puVar7;
  long *plVar8;
  undefined8 extraout_RDX;
  ulong uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  size_t __n;
  long lStack_68;
  undefined8 uStack_60;
  long local_10;
  stat_t stat;
  
  puVar7 = (undefined8 *)0x8;
  uVar10 = 8;
  iVar3 = vmemcache_get_stat(cache,8,&local_10);
  if (iVar3 == -1) {
    verify_heap_entries_cold_2();
  }
  else if (local_10 == 1) {
    return;
  }
  verify_heap_entries_cold_1();
  lVar5 = puVar7[3];
  puVar7[3] = lVar5 + 1U;
  if ((ulong)puVar7[5] < lVar5 + 1U) {
    return;
  }
  puVar7[4] = puVar7[4] + 1;
  plVar8 = (long *)*puVar7;
  iVar3 = vmemcache_put();
  if (iVar3 == 0) {
    return;
  }
  piVar4 = __errno_location();
  if (*piVar4 == 0x1c) {
    return;
  }
  uVar11 = uVar10;
  on_evict_test_put_in_evict_cb_cold_1();
  plVar8[3] = plVar8[3] + 1;
  uStack_60 = uVar10;
  lVar5 = vmemcache_get();
  if (lVar5 < 0) {
    on_evict_test_data_integrity_cold_8();
LAB_00107080:
    on_evict_test_data_integrity_cold_1();
LAB_00107088:
    on_evict_test_data_integrity_cold_2();
LAB_00107095:
    on_evict_test_data_integrity_cold_3();
LAB_0010709d:
    on_evict_test_data_integrity_cold_7();
LAB_001070a2:
    on_evict_test_data_integrity_cold_4();
  }
  else {
    plVar2 = (long *)plVar8[1];
    uVar9 = plVar2[1];
    lVar1 = uVar9 + 0x10;
    if (lVar5 != lVar1) goto LAB_00107080;
    if (lStack_68 != lVar1) goto LAB_00107088;
    __s1 = plVar2 + 2;
    iVar3 = bcmp(__s1,(void *)(*plVar8 + *plVar2),uVar9);
    if (iVar3 != 0) goto LAB_00107095;
    if (uVar9 < 0x101) {
      __n = uVar9 - 1;
    }
    else {
      iVar3 = rand();
      __n = (ulong)(long)iVar3 % (plVar2[1] - 0x100U) + 0x100;
    }
    iVar3 = rand();
    uVar9 = (ulong)(long)iVar3 % (plVar2[1] - __n);
    sVar6 = vmemcache_get(uVar11,piVar4,extraout_RDX,__s1,__n,uVar9 + 0x11,&lStack_68);
    if ((long)sVar6 < 0) goto LAB_0010709d;
    if (sVar6 != __n) goto LAB_001070a2;
    if (lStack_68 == lVar1) {
      iVar3 = bcmp(__s1,(void *)(*plVar8 + *plVar2 + uVar9 + 1),__n);
      if (iVar3 == 0) {
        return;
      }
      goto LAB_001070b6;
    }
  }
  on_evict_test_data_integrity_cold_5();
LAB_001070b6:
  on_evict_test_data_integrity_cold_6();
  halt_baddata();
}

Assistant:

static void
verify_heap_entries(VMEMcache *cache, stat_t entries)
{
#ifdef STATS_ENABLED
	stat_t stat;
	int ret;

	ret = vmemcache_get_stat(cache, VMEMCACHE_STAT_HEAP_ENTRIES,
			&stat, sizeof(stat));
	if (ret == -1)
		UT_FATAL("vmemcache_get_stat: %s", vmemcache_errormsg());
	if (stat != entries)
		UT_FATAL(
			"vmemcache_get_stat: wrong statistic's (%s) value: %llu (should be %llu)",
			stat_str[VMEMCACHE_STAT_HEAP_ENTRIES], stat, entries);
#endif
}